

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

Message * __thiscall testing::Message::operator<<(Message *this,wstring *wstr)

{
  size_type sVar1;
  pointer pwVar2;
  size_type sVar3;
  int in_ECX;
  size_type sVar4;
  string local_50;
  
  sVar1 = wstr->_M_string_length;
  if (sVar1 != 0) {
    pwVar2 = (wstr->_M_dataplus)._M_p;
    sVar4 = 0;
    do {
      if (pwVar2[sVar4] == L'\0') {
        local_50._M_dataplus._M_p._0_1_ = 0;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)
                   ((this->ss_)._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 0x10),(char *)&local_50,1);
        sVar4 = sVar4 + 1;
      }
      else {
        internal::WideStringToUtf8_abi_cxx11_
                  (&local_50,(internal *)(pwVar2 + sVar4),
                   (wchar_t *)(ulong)(uint)((int)sVar1 - (int)sVar4),in_ECX);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)
                   ((this->ss_)._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 0x10),
                   (char *)CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_)
                   ,local_50._M_string_length);
        sVar3 = sVar4;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_) !=
            &local_50.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_),
                          local_50.field_2._M_allocated_capacity + 1);
        }
        for (; (sVar1 != sVar3 && (sVar4 = sVar3, pwVar2[sVar3] != L'\0')); sVar3 = sVar3 + 1) {
          sVar4 = sVar1;
        }
      }
    } while (sVar4 != sVar1);
  }
  return this;
}

Assistant:

Message& Message::operator <<(const ::std::wstring& wstr) {
  internal::StreamWideCharsToMessage(wstr.c_str(), wstr.length(), this);
  return *this;
}